

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

FeatureSetDefaults * __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::ReadEditionDefaults
          (FeatureSetDefaults *__return_storage_ptr__,CommandLineInterfaceTest *this,
          string_view filename)

{
  bool bVar1;
  string_view data;
  string_view str;
  string file_contents;
  LogMessage LStack_58;
  string local_48;
  
  FeatureSetDefaults::FeatureSetDefaults(__return_storage_ptr__,(Arena *)0x0);
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            (&local_48,this,filename);
  data._M_str = local_48._M_dataplus._M_p;
  data._M_len = local_48._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,data);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x167,"defaults.ParseFromString(file_contents)");
    str._M_str = "Could not parse file contents: ";
    str._M_len = 0x1f;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_58,str)
    ;
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_58,filename);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_58);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FeatureSetDefaults CommandLineInterfaceTest::ReadEditionDefaults(
    absl::string_view filename) {
  FeatureSetDefaults defaults;
  std::string file_contents = ReadFile(filename);
  ABSL_CHECK(defaults.ParseFromString(file_contents))
      << "Could not parse file contents: " << filename;
  return defaults;
}